

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

void __thiscall
duckdb_snappy::internal::WorkingMemory::WorkingMemory(WorkingMemory *this,size_t input_size)

{
  uint32_t uVar1;
  uint16_t *puVar2;
  size_type __n;
  ulong uVar3;
  new_allocator<char> local_19;
  
  uVar3 = 0x10000;
  if (input_size < 0x10000) {
    uVar3 = input_size;
  }
  uVar1 = anon_unknown_3::CalculateTableSize((uint32_t)uVar3);
  __n = (uVar3 & 0xffffffff) / 6 + (uVar3 & 0xffffffff) * 2 + (ulong)uVar1 * 2 + 0x20;
  this->size_ = __n;
  puVar2 = (uint16_t *)__gnu_cxx::new_allocator<char>::allocate(&local_19,__n,(void *)0x0);
  this->mem_ = (char *)puVar2;
  this->table_ = puVar2;
  this->input_ = (char *)(puVar2 + uVar1);
  this->output_ = (char *)(uVar3 + (long)(puVar2 + uVar1));
  return;
}

Assistant:

WorkingMemory::WorkingMemory(size_t input_size) {
  const size_t max_fragment_size = std::min(input_size, kBlockSize);
  const size_t table_size = CalculateTableSize(max_fragment_size);
  size_ = table_size * sizeof(*table_) + max_fragment_size +
          MaxCompressedLength(max_fragment_size);
  mem_ = std::allocator<char>().allocate(size_);
  table_ = reinterpret_cast<uint16_t*>(mem_);
  input_ = mem_ + table_size * sizeof(*table_);
  output_ = input_ + max_fragment_size;
}